

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FillHelper
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  RecyclableObject *aValue;
  Var pvVar7;
  uint64 uVar8;
  uint64 uVar9;
  uint64 uVar10;
  int64 i;
  int64 i_1;
  ulong uVar11;
  double value;
  undefined1 local_90 [8];
  BigIndex dstIndex;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ulong local_48;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pArr);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x250b,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar3) goto LAB_00b8054a;
    *puVar5 = 0;
  }
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pTVar6 = typedArrayBase;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      pTVar6 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      pTVar6 = (TypedArrayBase *)0x0;
    }
  }
  if (((ulong)args->Info & 0xfffffe) == 0) {
    aValue = (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    aValue = (RecyclableObject *)Arguments::operator[](args,1);
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b80006;
        if ((ulong)aValue >> 0x32 == 0) {
          value = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
        }
        else {
          value = (double)((ulong)aValue ^ 0xfffc000000000000);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b8054a;
        *puVar5 = 0;
LAB_00b80006:
        value = (double)(int)aValue;
      }
      aValue = (RecyclableObject *)JavascriptNumber::ToVarNoCheck(value,scriptContext);
    }
  }
  local_48 = length;
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    uVar8 = 0;
    dstIndex.bigIndex = (uint64)pArr;
  }
  else {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar7 = Arguments::operator[](args,2);
    uVar8 = GetIndexFromVar(pvVar7,length,scriptContext);
    if (((ulong)args->Info & 0xfffffc) != 0) {
      pvVar7 = Arguments::operator[](args,3);
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar7);
      if (BVar4 == 0) {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar7 = Arguments::operator[](args,3);
        local_48 = GetIndexFromVar(pvVar7,length,scriptContext);
      }
    }
    if (pArr == (JavascriptArray *)0x0) {
LAB_00b8011c:
      pArr = (JavascriptArray *)0x0;
    }
    else {
      bVar3 = IsNonES5Array(obj);
      if (!bVar3) {
        bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2535,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar3) {
LAB_00b8054a:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        goto LAB_00b8011c;
      }
    }
    dstIndex.bigIndex = (uint64)pArr;
    if (0xfffffffe < (long)uVar8) {
      BigIndex::BigIndex((BigIndex *)local_90,uVar8);
      if ((long)uVar8 < (long)local_48) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          if (dstIndex.bigIndex == 0) {
            *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (uVar8 - 0x80000000 < 0xffffffff00000000) {
              jsReentLock._24_8_ = (BADTYPE)(long)uVar8;
              uVar9 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_);
              bVar3 = NumberUtilities::IsNan((double)jsReentLock._24_8_);
              if (((bVar3) &&
                  (uVar10 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
                  uVar10 != 0xfff8000000000000)) &&
                 (uVar10 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
                 uVar10 != 0x7ff8000000000000)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar5 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar3) goto LAB_00b8054a;
                *puVar5 = 0;
              }
              pvVar7 = (Var)(uVar9 ^ 0xfffc000000000000);
            }
            else {
              pvVar7 = (Var)(uVar8 & 0xffffffff | 0x1000000000000);
            }
            JavascriptOperators::OP_SetElementI
                      (obj,pvVar7,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            *(bool *)((long)local_70 + 0x108) = true;
          }
          else {
            BigIndex::SetItem((BigIndex *)local_90,(JavascriptArray *)dstIndex.bigIndex,aValue);
            if (local_90._0_4_ == 0xffffffff) {
              dstIndex._0_8_ = dstIndex._0_8_ + 1;
            }
            else {
              local_90._0_4_ = local_90._0_4_ + 1;
            }
          }
          uVar8 = uVar8 + 1;
        } while (local_48 != uVar8);
      }
      goto LAB_00b804f9;
    }
  }
  uVar11 = 0xffffffff;
  if ((long)local_48 < 0xffffffff) {
    uVar11 = local_48;
  }
  if ((long)(uVar8 & 0xffffffff) < (long)uVar11) {
    do {
      if (pTVar6 == (TypedArrayBase *)0x0) {
        if (dstIndex.bigIndex == 0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          JavascriptOperators::OP_SetElementI_UInt32
                    (obj,(uint32)uVar8,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
          goto LAB_00b80304;
        }
        (**(code **)(*(long *)dstIndex.bigIndex + 0x148))
                  (dstIndex.bigIndex,uVar8 & 0xffffffff,aValue,4);
      }
      else {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        (*(pTVar6->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(pTVar6,uVar8 & 0xffffffff,aValue);
LAB_00b80304:
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
      }
      uVar8 = (uint64)((uint32)uVar8 + 1);
    } while (uVar8 < uVar11);
  }
  BigIndex::BigIndex((BigIndex *)local_90,0xffffffff);
  if (0xffffffff < (long)local_48) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (dstIndex.bigIndex == 0) {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (uVar11 - 0x80000000 < 0xffffffff00000000) {
          jsReentLock._24_8_ = (BADTYPE)(long)uVar11;
          uVar8 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_);
          bVar3 = NumberUtilities::IsNan((double)jsReentLock._24_8_);
          if (((bVar3) &&
              (uVar9 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
              uVar9 != 0xfff8000000000000)) &&
             (uVar9 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
             uVar9 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) goto LAB_00b8054a;
            *puVar5 = 0;
          }
          pvVar7 = (Var)(uVar8 ^ 0xfffc000000000000);
        }
        else {
          pvVar7 = (Var)(uVar11 & 0xffffffff | 0x1000000000000);
        }
        JavascriptOperators::OP_SetElementI
                  (obj,pvVar7,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
      }
      else {
        BigIndex::SetItem((BigIndex *)local_90,(JavascriptArray *)dstIndex.bigIndex,aValue);
        if (local_90._0_4_ == 0xffffffff) {
          dstIndex._0_8_ = dstIndex._0_8_ + 1;
        }
        else {
          local_90._0_4_ = local_90._0_4_ + 1;
        }
      }
      uVar11 = uVar11 + 1;
    } while (local_48 != uVar11);
  }
LAB_00b804f9:
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return obj;
}

Assistant:

Var JavascriptArray::FillHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        Assert(args.Info.Count > 0);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        // If we came from Array.prototype.fill and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var fillValue;

        if (args.Info.Count > 1)
        {
            fillValue = args[1];
            if (isTypedArrayEntryPoint)
            {
                JS_REENTRANT_UNLOCK(jsReentLock, fillValue = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(fillValue, scriptContext), scriptContext));
            }
        }
        else
        {
            fillValue = library->GetUndefined();
        }

        int64 k = 0;
        int64 finalVal = length;

        if (args.Info.Count > 2)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, k = JavascriptArray::GetIndexFromVar(args[2], length, scriptContext));

            if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, finalVal = JavascriptArray::GetIndexFromVar(args[3], length, scriptContext));
            }

            // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
            // we will process the array elements like an ES5Array.
            if (pArr && !JavascriptArray::IsNonES5Array(obj))
            {
                AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                pArr = nullptr;
            }
        }

        if (k < MaxArrayLength)
        {
            int64 end = min<int64>(finalVal, MaxArrayLength);
            uint32 u32k = static_cast<uint32>(k);

            while (u32k < end)
            {
                if (typedArrayBase)
                {
                    JS_REENTRANT(jsReentLock, typedArrayBase->DirectSetItem(u32k, fillValue));
                }
                else if (pArr)
                {
                    pArr->SetItem(u32k, fillValue, PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI_UInt32(obj, u32k, fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }

                u32k++;
            }

            BigIndex dstIndex = MaxArrayLength;

            for (int64 i = end; i < finalVal; ++i)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }
        else
        {
            BigIndex dstIndex = static_cast<uint64>(k);

            for (int64 i = k; i < finalVal; i++)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }

        return obj;
    }